

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeSymbol.cpp
# Opt level: O0

ConstantValue * __thiscall slang::ast::AttributeSymbol::getValue(AttributeSymbol *this)

{
  int iVar1;
  undefined4 extraout_var;
  ConstantValue *pCVar2;
  long in_RDI;
  LookupLocation LVar3;
  Expression *bound;
  ASTContext context;
  Scope *bindScope;
  LookupLocation loc;
  Expression *in_stack_00000278;
  ASTContext *in_stack_00000280;
  bitmask<slang::ast::EvalFlags> in_stack_0000028f;
  ConstantValue *in_stack_fffffffffffffed8;
  Symbol *in_stack_fffffffffffffee0;
  Compilation *this_00;
  ASTContext *in_stack_fffffffffffffee8;
  bitmask<slang::ast::ASTFlags> flags;
  Scope *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  bitmask<slang::ast::EvalFlags> local_c9 [41];
  bitmask<slang::ast::ASTFlags> local_a0;
  undefined8 local_98;
  bitmask<slang::ast::ASTFlags> local_90;
  Scope *local_88;
  undefined8 uStack_80;
  undefined1 local_78 [56];
  Scope *local_40;
  uint32_t local_38;
  Scope *local_30;
  uint32_t local_28;
  Compilation *local_20;
  Scope *local_18;
  undefined8 uStack_10;
  
  if (*(long *)(in_RDI + 0x58) == 0) {
    local_18 = *(Scope **)(in_RDI + 0x60);
    uStack_10 = *(undefined8 *)(in_RDI + 0x68);
    local_20 = *(Compilation **)(in_RDI + 0x48);
    if (*(long *)(in_RDI + 0x40) != 0) {
      local_20 = (Compilation *)Symbol::getParentScope(*(Symbol **)(in_RDI + 0x40));
      LVar3 = LookupLocation::before(in_stack_fffffffffffffee0);
      local_40 = LVar3.scope;
      local_38 = LVar3.index;
      uStack_10 = CONCAT44(uStack_10._4_4_,local_38);
      local_30 = local_40;
      local_28 = local_38;
      local_18 = local_40;
    }
    local_88 = local_18;
    uStack_80 = uStack_10;
    this_00 = local_20;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_90,NonProcedural);
    flags.m_bits = (underlying_type)local_78;
    LVar3._8_8_ = in_stack_ffffffffffffff00;
    LVar3.scope = in_stack_fffffffffffffef8;
    ASTContext::ASTContext(in_stack_fffffffffffffee8,(Scope *)this_00,LVar3,flags);
    iVar1 = (int)*(undefined8 *)(in_RDI + 0x50);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_a0,None);
    iVar1 = Expression::bind(iVar1,(sockaddr *)flags.m_bits,(socklen_t)local_a0.m_bits);
    local_98 = CONCAT44(extraout_var,iVar1);
    Scope::getCompilation((Scope *)local_20);
    local_c9[0].m_bits = '\0';
    bitmask<slang::ast::EvalFlags>::bitmask(local_c9);
    ASTContext::eval(in_stack_00000280,in_stack_00000278,in_stack_0000028f);
    pCVar2 = Compilation::allocConstant(this_00,in_stack_fffffffffffffed8);
    *(ConstantValue **)(in_RDI + 0x58) = pCVar2;
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xbeec16);
  }
  return *(ConstantValue **)(in_RDI + 0x58);
}

Assistant:

const ConstantValue& AttributeSymbol::getValue() const {
    if (!value) {
        LookupLocation loc = lookupLocation;
        auto bindScope = scope;
        if (symbol) {
            bindScope = symbol->getParentScope();
            loc = LookupLocation::before(*symbol);
        }

        SLANG_ASSERT(bindScope);
        SLANG_ASSERT(expr);

        ASTContext context(*bindScope, loc, ASTFlags::NonProcedural);
        auto& bound = Expression::bind(*expr, context);

        value = bindScope->getCompilation().allocConstant(context.eval(bound));
    }

    return *value;
}